

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShaders.cpp
# Opt level: O0

void __thiscall
rr::GeometryShader::GeometryShader
          (GeometryShader *this,size_t numVaryingInputs,size_t numVaryingOutputs,
          GeometryShaderInputType inputType,GeometryShaderOutputType outputType,size_t verticesOut,
          size_t numInvocations)

{
  size_type __n;
  allocator<rr::VertexVaryingInfo> local_45 [20];
  allocator<rr::VertexVaryingInfo> local_31;
  size_t local_30;
  size_t verticesOut_local;
  GeometryShaderOutputType outputType_local;
  GeometryShaderInputType inputType_local;
  size_t numVaryingOutputs_local;
  size_t numVaryingInputs_local;
  GeometryShader *this_local;
  
  this->_vptr_GeometryShader = (_func_int **)&PTR___cxa_pure_virtual_00cbcd90;
  this->m_inputType = inputType;
  this->m_outputType = outputType;
  this->m_numVerticesOut = verticesOut;
  this->m_numInvocations = numInvocations;
  local_30 = verticesOut;
  verticesOut_local._0_4_ = outputType;
  verticesOut_local._4_4_ = inputType;
  _outputType_local = numVaryingOutputs;
  numVaryingOutputs_local = numVaryingInputs;
  numVaryingInputs_local = (size_t)this;
  std::allocator<rr::VertexVaryingInfo>::allocator(&local_31);
  std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::vector
            (&this->m_inputs,numVaryingInputs,&local_31);
  std::allocator<rr::VertexVaryingInfo>::~allocator(&local_31);
  __n = _outputType_local;
  std::allocator<rr::VertexVaryingInfo>::allocator(local_45);
  std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::vector
            (&this->m_outputs,__n,local_45);
  std::allocator<rr::VertexVaryingInfo>::~allocator(local_45);
  return;
}

Assistant:

GeometryShader::GeometryShader (size_t numVaryingInputs, size_t numVaryingOutputs, GeometryShaderInputType inputType, GeometryShaderOutputType outputType, size_t verticesOut, size_t numInvocations)
	: m_inputType		(inputType)
	, m_outputType		(outputType)
	, m_numVerticesOut	(verticesOut)
	, m_numInvocations	(numInvocations)
	, m_inputs			(numVaryingInputs)
	, m_outputs			(numVaryingOutputs)
{
}